

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O2

void update_xz_tilde(OSQPWorkspace *work)

{
  OSQPData *pOVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  pOVar1 = work->data;
  lVar2 = pOVar1->n;
  lVar3 = 0;
  lVar4 = 0;
  if (0 < lVar2) {
    lVar4 = lVar2;
  }
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    work->xz_tilde[lVar3] = work->settings->sigma * work->x_prev[lVar3] - pOVar1->q[lVar3];
  }
  lVar3 = 0;
  lVar4 = pOVar1->m;
  if (pOVar1->m < 1) {
    lVar4 = lVar3;
  }
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    work->xz_tilde[lVar2 + lVar3] = work->z_prev[lVar3] - work->rho_inv_vec[lVar3] * work->y[lVar3];
  }
  (*work->linsys_solver->solve)(work->linsys_solver,work->xz_tilde);
  return;
}

Assistant:

void update_xz_tilde(OSQPWorkspace *work) {
  // Compute right-hand side
  compute_rhs(work);

  // Solve linear system
  work->linsys_solver->solve(work->linsys_solver, work->xz_tilde);
}